

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

void __thiscall
soplex::SPxMainSM<double>::RowSingletonPS::execute
          (RowSingletonPS *this,VectorBase<double> *x,VectorBase<double> *y,VectorBase<double> *s,
          VectorBase<double> *r,DataArray<soplex::SPxSolverBase<double>::VarStatus> *cStatus,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *rStatus,bool isOptimal)

{
  double b;
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  pointer pdVar5;
  Nonzero<double> *pNVar6;
  bool bVar7;
  long lVar8;
  pointer pdVar9;
  ulong uVar10;
  ulong uVar11;
  double dVar12;
  double eps;
  double eps_00;
  double eps_01;
  double eps_02;
  double eps_03;
  double extraout_XMM0_Qa;
  double eps_04;
  double extraout_XMM0_Qa_00;
  double eps_05;
  double eps_06;
  double eps_07;
  double eps_08;
  double extraout_XMM0_Qa_01;
  double eps_09;
  double extraout_XMM0_Qa_02;
  double eps_10;
  double dVar13;
  double dVar14;
  double dVar15;
  double local_68;
  
  iVar1 = this->m_i;
  iVar2 = this->m_old_i;
  if (iVar1 != iVar2) {
    pdVar5 = (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5[iVar2] = pdVar5[iVar1];
    pdVar5 = (s->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5[iVar2] = pdVar5[iVar1];
    rStatus->data[iVar2] = rStatus->data[iVar1];
  }
  dVar12 = SVectorBase<double>::operator[](&(this->m_col).super_SVectorBase<double>,iVar1);
  iVar1 = this->m_j;
  pdVar5 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar2 = this->m_i;
  lVar8 = (long)iVar2;
  (s->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[lVar8] = pdVar5[iVar1] * dVar12;
  dVar13 = this->m_obj;
  uVar3 = (this->m_col).super_SVectorBase<double>.memused;
  pNVar6 = (this->m_col).super_SVectorBase<double>.m_elem;
  pdVar9 = (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar11 = 0;
  uVar10 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar10 = uVar11;
  }
  for (; uVar10 * 0x10 != uVar11; uVar11 = uVar11 + 0x10) {
    iVar4 = *(int *)((long)&pNVar6->idx + uVar11);
    if (iVar4 != iVar2) {
      dVar13 = dVar13 - *(double *)((long)&pNVar6->val + uVar11) * pdVar9[iVar4];
    }
  }
  dVar15 = this->m_lhs;
  if (dVar12 <= 0.0) {
    dVar15 = this->m_rhs;
  }
  switch(cStatus->data[iVar1]) {
  case ON_UPPER:
    dVar15 = this->m_oldUp;
    goto LAB_001bbc3a;
  case ON_LOWER:
    dVar15 = this->m_oldLo;
LAB_001bbc3a:
    dVar14 = pdVar5[iVar1];
    (*(this->super_PostStep)._vptr_PostStep[6])(this);
    bVar7 = EQrel<double,double,double>(dVar15,dVar14,eps);
    if (bVar7) {
      iVar1 = this->m_i;
      rStatus->data[iVar1] = BASIC;
      (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar1] = this->m_row_obj;
      lVar8 = (long)this->m_j;
LAB_001bbc94:
      pdVar9 = (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
LAB_001bbc9d:
      pdVar9[lVar8] = dVar13;
    }
    else {
      iVar1 = this->m_j;
      cStatus->data[iVar1] = BASIC;
      dVar15 = this->m_lhs;
      dVar14 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar1];
      (*(this->super_PostStep)._vptr_PostStep[6])(this);
      bVar7 = EQrel<double,double,double>(dVar15 / dVar12,dVar14,eps_00);
      iVar1 = this->m_i;
      rStatus->data[iVar1] = (uint)bVar7;
      (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar1] = dVar13 / dVar12;
      lVar8 = (long)this->m_j;
LAB_001bbd1f:
      (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar8] = 0.0;
    }
    break;
  case FIXED:
    dVar15 = dVar15 / dVar12;
    dVar14 = (double)(~-(ulong)(0.0 < dVar12) & (ulong)this->m_lhs |
                     (ulong)this->m_rhs & -(ulong)(0.0 < dVar12)) / dVar12;
    if ((this->m_oldLo < dVar15) || (dVar14 < this->m_oldUp)) {
      (*(this->super_PostStep)._vptr_PostStep[6])(this);
      bVar7 = EQrel<double,double,double>(dVar15,dVar14,eps_01);
      if (bVar7) {
        dVar15 = this->m_oldLo;
        dVar14 = this->m_oldUp;
        (*(this->super_PostStep)._vptr_PostStep[6])(this);
        bVar7 = EQrel<double,double,double>(dVar15,dVar14,eps_02);
        if (bVar7) {
LAB_001bc093:
          lVar8 = (long)this->m_i;
          rStatus->data[lVar8] = BASIC;
          dVar13 = this->m_row_obj;
          pdVar9 = (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          goto LAB_001bbc9d;
        }
        dVar15 = this->m_oldLo;
        dVar14 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[this->m_j];
        (*(this->super_PostStep)._vptr_PostStep[6])(this);
        bVar7 = EQrel<double,double,double>(dVar15,dVar14,eps_03);
        if ((!bVar7) ||
           (dVar15 = (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[this->m_j],
           (*(this->super_PostStep)._vptr_PostStep[6])(this), -extraout_XMM0_Qa < dVar15)) {
          dVar15 = this->m_oldUp;
          dVar14 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[this->m_j];
          (*(this->super_PostStep)._vptr_PostStep[6])(this);
          bVar7 = EQrel<double,double,double>(dVar15,dVar14,eps_04);
          if ((!bVar7) ||
             (dVar15 = (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[this->m_j],
             (*(this->super_PostStep)._vptr_PostStep[6])(this), dVar15 < extraout_XMM0_Qa_00)) {
            dVar15 = this->m_oldLo;
            dVar14 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[this->m_j];
            (*(this->super_PostStep)._vptr_PostStep[6])(this);
            bVar7 = EQrel<double,double,double>(dVar15,dVar14,eps_05);
            if (bVar7) {
LAB_001bbf15:
              dVar12 = this->m_oldLo;
              dVar15 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[this->m_j];
              (*(this->super_PostStep)._vptr_PostStep[6])(this);
              bVar7 = EQrel<double,double,double>(dVar12,dVar15,eps_07);
              iVar1 = this->m_j;
              cStatus->data[iVar1] = (uint)bVar7;
              iVar2 = this->m_i;
              rStatus->data[iVar2] = BASIC;
              (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar2] = this->m_row_obj;
              (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar1] = dVar13;
              return;
            }
            dVar15 = this->m_oldUp;
            dVar14 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[this->m_j];
            (*(this->super_PostStep)._vptr_PostStep[6])(this);
            bVar7 = EQrel<double,double,double>(dVar15,dVar14,eps_06);
            if (bVar7) goto LAB_001bbf15;
          }
        }
        local_68 = this->m_lhs;
        dVar15 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[this->m_j] * dVar12;
LAB_001bc0f6:
        (*(this->super_PostStep)._vptr_PostStep[6])(this);
        bVar7 = EQrel<double,double,double>(local_68,dVar15,eps_10);
        iVar1 = this->m_i;
        rStatus->data[iVar1] = (uint)bVar7;
        lVar8 = (long)this->m_j;
        cStatus->data[lVar8] = BASIC;
        (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[iVar1] = dVar13 / dVar12;
        goto LAB_001bbd1f;
      }
      b = this->m_oldUp;
      (*(this->super_PostStep)._vptr_PostStep[6])(this);
      bVar7 = EQrel<double,double,double>(dVar15,b,eps_08);
      if (bVar7) {
        dVar15 = (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[this->m_j];
        (*(this->super_PostStep)._vptr_PostStep[6])(this);
        if (extraout_XMM0_Qa_01 <= dVar15) {
LAB_001bc0b8:
          local_68 = this->m_lhs / dVar12;
          dVar15 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[this->m_j];
          goto LAB_001bc0f6;
        }
        lVar8 = (long)this->m_j;
        cStatus->data[lVar8] = ON_UPPER;
      }
      else {
        dVar15 = this->m_oldLo;
        (*(this->super_PostStep)._vptr_PostStep[6])(this);
        bVar7 = EQrel<double,double,double>(dVar14,dVar15,eps_09);
        if (!bVar7) goto LAB_001bc093;
        dVar15 = (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[this->m_j];
        (*(this->super_PostStep)._vptr_PostStep[6])(this);
        if (dVar15 <= -extraout_XMM0_Qa_02) goto LAB_001bc0b8;
        lVar8 = (long)this->m_j;
        cStatus->data[lVar8] = ON_LOWER;
      }
      iVar1 = this->m_i;
      rStatus->data[iVar1] = BASIC;
      (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar1] = this->m_row_obj;
      goto LAB_001bbc94;
    }
    rStatus->data[lVar8] = BASIC;
    dVar13 = this->m_row_obj;
    goto LAB_001bbc9d;
  case ZERO:
    rStatus->data[lVar8] = BASIC;
    pdVar9[lVar8] = this->m_row_obj;
    (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[iVar1] = dVar13;
    break;
  case BASIC:
    rStatus->data[lVar8] = BASIC;
    pdVar9[lVar8] = this->m_row_obj;
    (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[iVar1] = 0.0;
  }
  return;
}

Assistant:

void SPxMainSM<R>::RowSingletonPS::execute(VectorBase<R>& x, VectorBase<R>& y, VectorBase<R>& s,
      VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // correcting the change of idx by deletion of the row:
   if(m_i != m_old_i)
   {
      y[m_old_i] = y[m_i];
      s[m_old_i] = s[m_i];
      rStatus[m_old_i] = rStatus[m_i];
   }

   R aij = m_col[m_i];
   assert(aij != 0.0);

   // primal:
   s[m_i] = aij * x[m_j];

   // dual & basis:
   R val = m_obj;

   for(int k = 0; k < m_col.size(); ++k)
   {
      if(m_col.index(k) != m_i)
         val -= m_col.value(k) * y[m_col.index(k)];
   }

   R newLo = (aij > 0) ? m_lhs / aij : m_rhs / aij; // implicit lhs
   R newUp = (aij > 0) ? m_rhs / aij : m_lhs / aij; // implicit rhs

   switch(cStatus[m_j])
   {
   case SPxSolverBase<R>::FIXED:
      if(newLo <= m_oldLo && newUp >= m_oldUp)
      {
         // this row is totally redundant, has not changed bound of xj
         rStatus[m_i] = SPxSolverBase<R>::BASIC;
         y[m_i] = m_row_obj;
      }
      else if(EQrel(newLo, newUp, this->feastol()))
      {
         // row is in the type  aij * xj = b
         assert(EQrel(newLo, x[m_j], this->feastol()));

         if(EQrel(m_oldLo, m_oldUp, this->feastol()))
         {
            // xj has been fixed in other row
            rStatus[m_i] = SPxSolverBase<R>::BASIC;
            y[m_i] = m_row_obj;
         }
         else if((EQrel(m_oldLo, x[m_j], this->feastol()) && r[m_j] <= -this->feastol())
                 || (EQrel(m_oldUp, x[m_j], this->feastol()) && r[m_j] >= this->feastol())
                 || (!EQrel(m_oldLo, x[m_j], this->feastol()) && !(EQrel(m_oldUp, x[m_j], this->feastol()))))
         {
            // if x_j on lower but reduced cost is negative, or x_j on upper but reduced cost is positive, or x_j not on bound: basic
            rStatus[m_i] = (EQrel(m_lhs, x[m_j] * aij,
                                  this->feastol())) ? SPxSolverBase<R>::ON_LOWER : SPxSolverBase<R>::ON_UPPER;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            y[m_i] = val / aij;
            r[m_j] = 0.0;
         }
         else
         {
            // set x_j on one of the bound
            assert(EQrel(m_oldLo, x[m_j], this->feastol()) || EQrel(m_oldUp, x[m_j], this->feastol()));

            cStatus[m_j] = EQrel(m_oldLo, x[m_j],
                                 this->feastol()) ? SPxSolverBase<R>::ON_LOWER : SPxSolverBase<R>::ON_UPPER;
            rStatus[m_i] = SPxSolverBase<R>::BASIC;
            y[m_i] = m_row_obj;
            r[m_j] = val;
         }
      }
      else if(EQrel(newLo, m_oldUp, this->feastol()))
      {
         // row is in the type  xj >= b/aij, try to set xj on upper
         if(r[m_j] >= this->feastol())
         {
            // the reduced cost is positive, xj should in the basic
            assert(EQrel(m_rhs / aij, x[m_j], this->feastol()) || EQrel(m_lhs / aij, x[m_j], this->feastol()));

            rStatus[m_i] = (EQrel(m_lhs / aij, x[m_j],
                                  this->feastol())) ? SPxSolverBase<R>::ON_LOWER : SPxSolverBase<R>::ON_UPPER;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            y[m_i] = val / aij;
            r[m_j] = 0.0;
         }
         else
         {
            assert(EQrel(m_oldUp, x[m_j], this->feastol()));

            cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
            rStatus[m_i] = SPxSolverBase<R>::BASIC;
            y[m_i] = m_row_obj;
            r[m_j] = val;
         }
      }
      else if(EQrel(newUp, m_oldLo, this->feastol()))
      {
         // row is in the type  xj <= b/aij, try to set xj on lower
         if(r[m_j] <= -this->feastol())
         {
            // the reduced cost is negative, xj should in the basic
            assert(EQrel(m_rhs / aij, x[m_j], this->feastol()) || EQrel(m_lhs / aij, x[m_j], this->feastol()));

            rStatus[m_i] = (EQrel(m_lhs / aij, x[m_j],
                                  this->feastol())) ? SPxSolverBase<R>::ON_LOWER : SPxSolverBase<R>::ON_UPPER;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            y[m_i] = val / aij;
            r[m_j] = 0.0;
         }
         else
         {
            assert(EQrel(m_oldLo, x[m_j], this->feastol()));

            cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
            rStatus[m_i] = SPxSolverBase<R>::BASIC;
            y[m_i] = m_row_obj;
            r[m_j] = val;
         }
      }
      else
      {
         // the variable is set to FIXED by other constraints, i.e., this singleton row is redundant
         rStatus[m_i] = SPxSolverBase<R>::BASIC;
         y[m_i] = m_row_obj;
      }

      break;

   case SPxSolverBase<R>::BASIC:
      rStatus[m_i] = SPxSolverBase<R>::BASIC;
      y[m_i] = m_row_obj;
      r[m_j] = 0.0;
      break;

   case SPxSolverBase<R>::ON_LOWER:
      if(EQrel(m_oldLo, x[m_j], this->feastol())) // xj may stay on lower
      {
         rStatus[m_i] = SPxSolverBase<R>::BASIC;
         y[m_i] = m_row_obj;
         r[m_j] = val;
      }
      else // if reduced costs are negative or old lower bound not equal to xj, we need to change xj into the basis
      {
         assert(!isOptimal || EQrel(m_rhs / aij, x[m_j], this->feastol())
                || EQrel(m_lhs / aij, x[m_j], this->feastol()));

         cStatus[m_j] = SPxSolverBase<R>::BASIC;
         rStatus[m_i] = (EQrel(m_lhs / aij, x[m_j],
                               this->feastol())) ? SPxSolverBase<R>::ON_LOWER : SPxSolverBase<R>::ON_UPPER;
         y[m_i] = val / aij;
         r[m_j] = 0.0;
      }

      break;

   case SPxSolverBase<R>::ON_UPPER:
      if(EQrel(m_oldUp, x[m_j], this->feastol())) // xj may stay on upper
      {
         rStatus[m_i] = SPxSolverBase<R>::BASIC;
         y[m_i] = m_row_obj;
         r[m_j] = val;
      }
      else // if reduced costs are positive or old upper bound not equal to xj, we need to change xj into the basis
      {
         assert(!isOptimal || EQrel(m_rhs / aij, x[m_j], this->feastol())
                || EQrel(m_lhs / aij, x[m_j], this->feastol()));

         cStatus[m_j] = SPxSolverBase<R>::BASIC;
         rStatus[m_i] = (EQrel(m_lhs / aij, x[m_j],
                               this->feastol())) ? SPxSolverBase<R>::ON_LOWER : SPxSolverBase<R>::ON_UPPER;
         y[m_i] = val / aij;
         r[m_j] = 0.0;
      }

      break;

   case SPxSolverBase<R>::ZERO:
      rStatus[m_i] = SPxSolverBase<R>::BASIC;
      y[m_i] = m_row_obj;
      r[m_j] = val;
      break;

   default:
      break;
   }

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM17 Dimension doesn't match after this step.");
   }

#endif
}